

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::TIntermediate::addUnaryMath
          (TIntermediate *this,TOperator op,TIntermTyped *child,TSourceLoc *loc)

{
  TBasicType t;
  byte bVar1;
  bool bVar2;
  int iVar3;
  EShSource EVar4;
  int mc;
  int mr;
  TOperator TVar5;
  undefined4 extraout_var;
  ulong uVar6;
  long *plVar7;
  TIntermediate *node_00;
  long lVar8;
  undefined8 uVar9;
  TQualifier *pTVar10;
  TIntermUnary *node;
  TIntermUnary *unary_node;
  TBasicType local_34;
  TSourceLoc *pTStack_30;
  TBasicType newType;
  TSourceLoc *loc_local;
  TIntermTyped *child_local;
  TIntermediate *pTStack_18;
  TOperator op_local;
  TIntermediate *this_local;
  
  if (child == (TIntermTyped *)0x0) {
    return (TIntermTyped *)0x0;
  }
  pTStack_30 = loc;
  loc_local = (TSourceLoc *)child;
  child_local._4_4_ = op;
  pTStack_18 = this;
  iVar3 = (*(child->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x38))();
  if (iVar3 == 0x10) {
    return (TIntermTyped *)0x0;
  }
  if (child_local._4_4_ == EOpNegative) {
LAB_00739a22:
    plVar7 = (long *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)();
    iVar3 = (**(code **)(*plVar7 + 0x38))();
    if (iVar3 != 0xf) {
      plVar7 = (long *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)();
      uVar6 = (**(code **)(*plVar7 + 0xe8))();
      if ((uVar6 & 1) == 0) goto LAB_00739a6d;
    }
    this_local = (TIntermediate *)0x0;
  }
  else {
    if (child_local._4_4_ == EOpLogicalNot) {
      EVar4 = getSource(this);
      if (EVar4 != EShSourceHlsl) {
        plVar7 = (long *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)();
        iVar3 = (**(code **)(*plVar7 + 0x38))();
        if (iVar3 != 0xc) {
          return (TIntermTyped *)0x0;
        }
        plVar7 = (long *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)();
        uVar6 = (**(code **)(*plVar7 + 0xe0))();
        if ((uVar6 & 1) != 0) {
          return (TIntermTyped *)0x0;
        }
        plVar7 = (long *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)();
        uVar6 = (**(code **)(*plVar7 + 0xe8))();
        if ((uVar6 & 1) != 0) {
          return (TIntermTyped *)0x0;
        }
        plVar7 = (long *)(*(code *)loc_local->name[6]._M_dataplus.super_allocator_type.allocator)();
        uVar6 = (**(code **)(*plVar7 + 0xd8))();
        if ((uVar6 & 1) != 0) {
          return (TIntermTyped *)0x0;
        }
      }
    }
    else if (child_local._4_4_ - EOpPostIncrement < 4) goto LAB_00739a22;
LAB_00739a6d:
    TVar5 = child_local._4_4_;
    local_34 = EbtVoid;
    switch(child_local._4_4_) {
    case EOpConstructInt:
      local_34 = EbtInt;
      break;
    case EOpConstructUint:
      local_34 = EbtUint;
      break;
    case EOpConstructInt8:
      local_34 = EbtInt8;
      break;
    case EOpConstructUint8:
      local_34 = EbtUint8;
      break;
    case EOpConstructInt16:
      local_34 = EbtInt16;
      break;
    case EOpConstructUint16:
      local_34 = EbtUint16;
      break;
    case EOpConstructInt64:
      local_34 = EbtInt64;
      break;
    case EOpConstructUint64:
      local_34 = EbtUint64;
      break;
    case EOpConstructBool:
      local_34 = EbtBool;
      break;
    case EOpConstructFloat:
      local_34 = EbtFloat;
      break;
    case EOpConstructDouble:
      local_34 = EbtDouble;
      break;
    default:
      break;
    case EOpConstructFloat16:
      local_34 = EbtFloat16;
    }
    t = local_34;
    if (local_34 != EbtVoid) {
      iVar3 = (*(code *)loc_local->name[7].field_2._M_allocated_capacity)();
      mc = (**(code **)((long)&loc_local->name[7].field_2 + 8))();
      mr = (*(code *)loc_local->name[8]._M_dataplus.super_allocator_type.allocator)();
      bVar1 = (*(code *)loc_local->name[8].field_2._M_allocated_capacity)();
      TType::TType((TType *)&unary_node,t,EvqTemporary,iVar3,mc,mr,(bool)(bVar1 & 1));
      loc_local = (TSourceLoc *)
                  addConversion(this,TVar5,(TType *)&unary_node,(TIntermTyped *)loc_local);
      TType::~TType((TType *)&unary_node);
      if (loc_local == (TSourceLoc *)0x0) {
        return (TIntermTyped *)0x0;
      }
    }
    if ((child_local._4_4_ - EOpConstructInt < 0xb) || (child_local._4_4_ == EOpConstructFloat16)) {
      plVar7 = (long *)(*(code *)loc_local->name[1]._M_string_length)();
      if (plVar7 != (long *)0x0) {
        (**(code **)(*plVar7 + 0x198))();
      }
      this_local = (TIntermediate *)loc_local;
    }
    else {
      node_00 = (TIntermediate *)
                addUnaryNode(this,child_local._4_4_,(TIntermTyped *)loc_local,pTStack_30);
      bVar2 = promote(this,(TIntermOperator *)node_00);
      if (bVar2) {
        (**(code **)(*(long *)node_00 + 0x198))();
        plVar7 = (long *)(**(code **)(*(long *)node_00 + 0x188))();
        lVar8 = (**(code **)(*plVar7 + 0x28))();
        if (lVar8 == 0) {
          plVar7 = (long *)(**(code **)(*(long *)node_00 + 0x188))();
          plVar7 = (long *)(**(code **)(*plVar7 + 0xf0))();
          pTVar10 = (TQualifier *)(**(code **)(*plVar7 + 0x58))();
          bVar2 = TQualifier::isSpecConstant(pTVar10);
          if ((bVar2) && (bVar2 = isSpecializationOperation(this,(TIntermOperator *)node_00), bVar2)
             ) {
            plVar7 = (long *)(**(code **)(*(long *)node_00 + 0xf8))();
            pTVar10 = (TQualifier *)(**(code **)(*plVar7 + 0x50))();
            TQualifier::makeSpecConstant(pTVar10);
          }
          plVar7 = (long *)(**(code **)(*(long *)node_00 + 0x188))();
          pTVar10 = (TQualifier *)(**(code **)(*plVar7 + 0x108))();
          bVar2 = TQualifier::isNonUniform(pTVar10);
          this_local = node_00;
          if (bVar2) {
            TVar5 = TIntermOperator::getOp((TIntermOperator *)node_00);
            bVar2 = isNonuniformPropagating(this,TVar5);
            if (bVar2) {
              plVar7 = (long *)(**(code **)(*(long *)node_00 + 0xf8))();
              lVar8 = (**(code **)(*plVar7 + 0x50))();
              *(ulong *)(lVar8 + 8) = *(ulong *)(lVar8 + 8) & 0xfffffffdffffffff | 0x200000000;
            }
          }
        }
        else {
          plVar7 = (long *)(**(code **)(*(long *)node_00 + 0x188))();
          plVar7 = (long *)(**(code **)(*plVar7 + 0x28))();
          TVar5 = child_local._4_4_;
          uVar9 = (**(code **)(*(long *)node_00 + 0xf0))();
          this_local = (TIntermediate *)(**(code **)(*plVar7 + 0x188))(plVar7,TVar5,uVar9);
        }
      }
      else {
        this_local = (TIntermediate *)0x0;
      }
    }
  }
  return (TIntermTyped *)this_local;
}

Assistant:

TIntermTyped* TIntermediate::addUnaryMath(TOperator op, TIntermTyped* child,
    const TSourceLoc& loc)
{
    if (child == nullptr)
        return nullptr;

    if (child->getType().getBasicType() == EbtBlock)
        return nullptr;

    switch (op) {
    case EOpLogicalNot:
        if (getSource() == EShSourceHlsl) {
            break; // HLSL can promote logical not
        }

        if (child->getType().getBasicType() != EbtBool || child->getType().isMatrix() || child->getType().isArray() || child->getType().isVector()) {
            return nullptr;
        }
        break;

    case EOpPostIncrement:
    case EOpPreIncrement:
    case EOpPostDecrement:
    case EOpPreDecrement:
    case EOpNegative:
        if (child->getType().getBasicType() == EbtStruct || child->getType().isArray())
            return nullptr;
        break;
    default: break; // some compilers want this
    }

    //
    // Do we need to promote the operand?
    //
    TBasicType newType = EbtVoid;
    switch (op) {
    case EOpConstructBool:   newType = EbtBool;   break;
    case EOpConstructFloat:  newType = EbtFloat;  break;
    case EOpConstructInt:    newType = EbtInt;    break;
    case EOpConstructUint:   newType = EbtUint;   break;
    case EOpConstructInt8:   newType = EbtInt8;   break;
    case EOpConstructUint8:  newType = EbtUint8;  break;
    case EOpConstructInt16:  newType = EbtInt16;  break;
    case EOpConstructUint16: newType = EbtUint16; break;
    case EOpConstructInt64:  newType = EbtInt64;  break;
    case EOpConstructUint64: newType = EbtUint64; break;
    case EOpConstructDouble: newType = EbtDouble; break;
    case EOpConstructFloat16: newType = EbtFloat16; break;
    default: break; // some compilers want this
    }

    if (newType != EbtVoid) {
        child = addConversion(op, TType(newType, EvqTemporary, child->getVectorSize(),
                                                               child->getMatrixCols(),
                                                               child->getMatrixRows(),
                                                               child->isVector()),
                              child);
        if (child == nullptr)
            return nullptr;
    }

    //
    // For constructors, we are now done, it was all in the conversion.
    // TODO: but, did this bypass constant folding?
    //
    switch (op) {
        case EOpConstructInt8:
        case EOpConstructUint8:
        case EOpConstructInt16:
        case EOpConstructUint16:
        case EOpConstructInt:
        case EOpConstructUint:
        case EOpConstructInt64:
        case EOpConstructUint64:
        case EOpConstructBool:
        case EOpConstructFloat:
        case EOpConstructDouble:
        case EOpConstructFloat16: {
            TIntermUnary* unary_node = child->getAsUnaryNode();
            if (unary_node != nullptr)
                unary_node->updatePrecision();
            return child;
        }
        default: break; // some compilers want this
    }

    //
    // Make a new node for the operator.
    //
    TIntermUnary* node = addUnaryNode(op, child, loc);

    if (! promote(node))
        return nullptr;

    node->updatePrecision();

    // If it's a (non-specialization) constant, it must be folded.
    if (node->getOperand()->getAsConstantUnion())
        return node->getOperand()->getAsConstantUnion()->fold(op, node->getType());

    // If it's a specialization constant, the result is too,
    // if the operation is allowed for specialization constants.
    if (node->getOperand()->getType().getQualifier().isSpecConstant() && isSpecializationOperation(*node))
        node->getWritableType().getQualifier().makeSpecConstant();

    // If must propagate nonuniform, make a nonuniform.
    if (node->getOperand()->getQualifier().isNonUniform() && isNonuniformPropagating(node->getOp()))
        node->getWritableType().getQualifier().nonUniform = true;

    return node;
}